

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_string.c
# Opt level: O1

int lj_ffh_string_byte(lua_State *L)

{
  MSize MVar1;
  int32_t iVar2;
  int iVar3;
  GCstr *pGVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  MSize MVar8;
  uint need;
  int iVar9;
  
  iVar2 = 1;
  pGVar4 = lj_lib_checkstr(L,1);
  MVar1 = pGVar4->len;
  if ((L->base + 1 < L->top) && (*(int *)((long)L->base + 0xc) != -1)) {
    iVar2 = lj_lib_checkint(L,2);
  }
  iVar3 = iVar2;
  if ((L->base + 2 < L->top) && (*(int *)((long)L->base + 0x14) != -1)) {
    iVar3 = lj_lib_checkint(L,3);
  }
  MVar8 = (iVar3 >> 0x1f & MVar1 + 1) + iVar3;
  iVar3 = (iVar2 >> 0x1f & MVar1 + 1) + iVar2;
  iVar9 = 1;
  if (iVar3 < 2) {
    iVar3 = 1;
  }
  if ((int)MVar1 <= (int)MVar8) {
    MVar8 = MVar1;
  }
  if (iVar3 <= (int)MVar8) {
    uVar7 = iVar3 - 1;
    need = MVar8 - uVar7;
    if (8000 < need) {
      lj_err_caller(L,LJ_ERR_STRSLC);
    }
    if ((long)((ulong)(L->maxstack).ptr32 - (long)L->top) <= (long)(ulong)(need * 8)) {
      lj_state_growstack(L,need);
    }
    if (MVar8 != uVar7) {
      uVar5 = 1;
      if (1 < (int)need) {
        uVar5 = (ulong)need;
      }
      uVar6 = 0;
      do {
        L->base[uVar6 - 1].n = (double)*(byte *)((long)&pGVar4[1].nextgc.gcptr32 + uVar6 + uVar7);
        uVar6 = uVar6 + 1;
      } while (uVar5 != uVar6);
    }
    iVar9 = need + 1;
  }
  return iVar9;
}

Assistant:

LJLIB_ASM(string_byte)		LJLIB_REC(string_range 0)
{
  GCstr *s = lj_lib_checkstr(L, 1);
  int32_t len = (int32_t)s->len;
  int32_t start = lj_lib_optint(L, 2, 1);
  int32_t stop = lj_lib_optint(L, 3, start);
  int32_t n, i;
  const unsigned char *p;
  if (stop < 0) stop += len+1;
  if (start < 0) start += len+1;
  if (start <= 0) start = 1;
  if (stop > len) stop = len;
  if (start > stop) return FFH_RES(0);  /* Empty interval: return no results. */
  start--;
  n = stop - start;
  if ((uint32_t)n > LUAI_MAXCSTACK)
    lj_err_caller(L, LJ_ERR_STRSLC);
  lj_state_checkstack(L, (MSize)n);
  p = (const unsigned char *)strdata(s) + start;
  for (i = 0; i < n; i++)
    setintV(L->base + i-1, p[i]);
  return FFH_RES(n);
}